

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O1

void __thiscall
TCPSocket::TCPSocketError::TCPSocketError(TCPSocketError *this,string *reason,int errorCode)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  pointer pcVar4;
  uint __val;
  long lVar5;
  uint uVar6;
  undefined8 *puVar7;
  long *plVar8;
  uint uVar9;
  size_type *psVar10;
  ulong uVar11;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  *(undefined ***)this = &PTR__TCPSocketError_001d5720;
  local_90 = local_80;
  pcVar4 = (reason->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + reason->_M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  uVar3 = this->code;
  __val = -uVar3;
  if (0 < (int)uVar3) {
    __val = uVar3;
  }
  __len = 1;
  if (9 < __val) {
    uVar11 = (ulong)__val;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar9 = (uint)uVar11;
      if (uVar9 < 100) {
        __len = __len - 2;
        goto LAB_0010f06a;
      }
      if (uVar9 < 1000) {
        __len = __len - 1;
        goto LAB_0010f06a;
      }
      if (uVar9 < 10000) goto LAB_0010f06a;
      uVar11 = uVar11 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar9);
    __len = __len + 1;
  }
LAB_0010f06a:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_50),__len,__val);
  uVar11 = 0xf;
  if (local_90 != local_80) {
    uVar11 = local_80[0];
  }
  if (uVar11 < (ulong)(local_48 + local_88)) {
    uVar11 = 0xf;
    if (local_50 != local_40) {
      uVar11 = local_40[0];
    }
    if ((ulong)(local_48 + local_88) <= uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_90);
      goto LAB_0010f0fe;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50);
LAB_0010f0fe:
  local_70 = &local_60;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_60 = *puVar1;
    uStack_58 = puVar7[3];
  }
  else {
    local_60 = *puVar1;
    local_70 = (undefined8 *)*puVar7;
  }
  local_68 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  paVar2 = &(this->reason).field_2;
  (this->reason)._M_dataplus._M_p = (pointer)paVar2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    lVar5 = plVar8[3];
    paVar2->_M_allocated_capacity = *psVar10;
    *(long *)((long)&(this->reason).field_2 + 8) = lVar5;
  }
  else {
    (this->reason)._M_dataplus._M_p = (pointer)*plVar8;
    (this->reason).field_2._M_allocated_capacity = *psVar10;
  }
  (this->reason)._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  this->code = errorCode;
  return;
}

Assistant:

TCPSocketError(std::string reason, int errorCode = 0) : reason(reason + " (" + std::to_string(code) + ")"), code(errorCode){}